

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
* __thiscall
CFG::filterAll0orAll1
          (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           *__return_storage_ptr__,CFG *this,
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *vector)

{
  ulong uVar1;
  bool bVar2;
  _Bit_type *p_Var3;
  uint uVar4;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *pvVar5;
  bool bVar6;
  uint uVar7;
  ulong *puVar8;
  pointer __x;
  uint uVar9;
  ulong uVar10;
  reference rVar11;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  filtered;
  vector<bool,_std::allocator<bool>_> permu;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_88;
  pointer local_70;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_68;
  vector<bool,_std::allocator<bool>_> *local_60;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (vector->
        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (vector->
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if ((local_70 == __x) ||
     (pvVar5 = __return_storage_ptr__,
     ((long)(__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p -
     (long)(__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p) * 8 +
     (ulong)(__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = __x;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = local_70;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (vector->
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (vector->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (vector->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (vector->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    while (local_68 = pvVar5, __x != local_70) {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_58,__x);
      local_60 = __x;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_58,0);
      uVar4 = local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
      ;
      p_Var3 = local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar1 = *rVar11._M_p;
      bVar6 = false;
      uVar10 = 0;
      puVar8 = local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      while ((uVar9 = (uint)uVar10, puVar8 != p_Var3 || (uVar9 != uVar4))) {
        bVar2 = !bVar6;
        bVar6 = true;
        if (bVar2) {
          if (((rVar11._M_mask & uVar1) != 0) == ((*puVar8 >> (uVar10 & 0x3f) & 1) != 0)) {
            bVar6 = false;
          }
          else {
            std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::push_back(&local_88,(value_type *)&local_58);
          }
        }
        uVar7 = uVar9 + 1;
        puVar8 = puVar8 + (uVar9 == 0x3f);
        if (uVar9 == 0x3f) {
          uVar7 = 0;
        }
        uVar10 = (ulong)uVar7;
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
      pvVar5 = local_68;
      __x = local_60 + 1;
    }
    (local_68->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_68->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_68->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ = local_68;
  }
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<bool>> CFG::filterAll0orAll1(std::vector<std::vector<bool>> vector) {
    std::vector<std::vector<bool>> filtered;

    if (vector.size() == 0 or vector[0].size() == 0) return vector;

    for (auto permu: vector) {
        bool symbol = permu[0];
        bool done = false;
        for (auto el: permu) {
            if (!done and symbol != el) {
                filtered.push_back(permu);
                done = true;
            }
        }
    }
    return filtered;
}